

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void vkb::detail::combine_features(VkPhysicalDeviceFeatures *dest,VkPhysicalDeviceFeatures src)

{
  bool local_56;
  bool local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  bool local_50;
  bool local_4f;
  bool local_4e;
  bool local_4d;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool local_49;
  bool local_48;
  bool local_47;
  bool local_46;
  bool local_45;
  bool local_44;
  bool local_43;
  bool local_42;
  bool local_41;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  bool local_38;
  bool local_37;
  bool local_36;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_11;
  VkPhysicalDeviceFeatures *dest_local;
  
  local_11 = dest->robustBufferAccess != 0 || src.robustBufferAccess != 0;
  dest->robustBufferAccess = (uint)local_11;
  local_21 = dest->fullDrawIndexUint32 != 0 || src.fullDrawIndexUint32 != 0;
  dest->fullDrawIndexUint32 = (uint)local_21;
  local_22 = dest->imageCubeArray != 0 || src.imageCubeArray != 0;
  dest->imageCubeArray = (uint)local_22;
  local_23 = dest->independentBlend != 0 || src.independentBlend != 0;
  dest->independentBlend = (uint)local_23;
  local_24 = dest->geometryShader != 0 || src.geometryShader != 0;
  dest->geometryShader = (uint)local_24;
  local_25 = dest->tessellationShader != 0 || src.tessellationShader != 0;
  dest->tessellationShader = (uint)local_25;
  local_26 = dest->sampleRateShading != 0 || src.sampleRateShading != 0;
  dest->sampleRateShading = (uint)local_26;
  local_27 = dest->dualSrcBlend != 0 || src.dualSrcBlend != 0;
  dest->dualSrcBlend = (uint)local_27;
  local_28 = dest->logicOp != 0 || src.logicOp != 0;
  dest->logicOp = (uint)local_28;
  local_29 = dest->multiDrawIndirect != 0 || src.multiDrawIndirect != 0;
  dest->multiDrawIndirect = (uint)local_29;
  local_2a = dest->drawIndirectFirstInstance != 0 || src.drawIndirectFirstInstance != 0;
  dest->drawIndirectFirstInstance = (uint)local_2a;
  local_2b = dest->depthClamp != 0 || src.depthClamp != 0;
  dest->depthClamp = (uint)local_2b;
  local_2c = dest->depthBiasClamp != 0 || src.depthBiasClamp != 0;
  dest->depthBiasClamp = (uint)local_2c;
  local_2d = dest->fillModeNonSolid != 0 || src.fillModeNonSolid != 0;
  dest->fillModeNonSolid = (uint)local_2d;
  local_2e = dest->depthBounds != 0 || src.depthBounds != 0;
  dest->depthBounds = (uint)local_2e;
  local_2f = dest->wideLines != 0 || src.wideLines != 0;
  dest->wideLines = (uint)local_2f;
  local_30 = dest->largePoints != 0 || src.largePoints != 0;
  dest->largePoints = (uint)local_30;
  local_31 = dest->alphaToOne != 0 || src.alphaToOne != 0;
  dest->alphaToOne = (uint)local_31;
  local_32 = dest->multiViewport != 0 || src.multiViewport != 0;
  dest->multiViewport = (uint)local_32;
  local_33 = dest->samplerAnisotropy != 0 || src.samplerAnisotropy != 0;
  dest->samplerAnisotropy = (uint)local_33;
  local_34 = dest->textureCompressionETC2 != 0 || src.textureCompressionETC2 != 0;
  dest->textureCompressionETC2 = (uint)local_34;
  local_35 = dest->textureCompressionASTC_LDR != 0 || src.textureCompressionASTC_LDR != 0;
  dest->textureCompressionASTC_LDR = (uint)local_35;
  local_36 = dest->textureCompressionBC != 0 || src.textureCompressionBC != 0;
  dest->textureCompressionBC = (uint)local_36;
  local_37 = dest->occlusionQueryPrecise != 0 || src.occlusionQueryPrecise != 0;
  dest->occlusionQueryPrecise = (uint)local_37;
  local_38 = dest->pipelineStatisticsQuery != 0 || src.pipelineStatisticsQuery != 0;
  dest->pipelineStatisticsQuery = (uint)local_38;
  local_39 = dest->vertexPipelineStoresAndAtomics != 0 || src.vertexPipelineStoresAndAtomics != 0;
  dest->vertexPipelineStoresAndAtomics = (uint)local_39;
  local_3a = dest->fragmentStoresAndAtomics != 0 || src.fragmentStoresAndAtomics != 0;
  dest->fragmentStoresAndAtomics = (uint)local_3a;
  local_3b = dest->shaderTessellationAndGeometryPointSize != 0 ||
             src.shaderTessellationAndGeometryPointSize != 0;
  dest->shaderTessellationAndGeometryPointSize = (uint)local_3b;
  local_3c = dest->shaderImageGatherExtended != 0 || src.shaderImageGatherExtended != 0;
  dest->shaderImageGatherExtended = (uint)local_3c;
  local_3d = dest->shaderStorageImageExtendedFormats != 0 ||
             src.shaderStorageImageExtendedFormats != 0;
  dest->shaderStorageImageExtendedFormats = (uint)local_3d;
  local_3e = dest->shaderStorageImageMultisample != 0 || src.shaderStorageImageMultisample != 0;
  dest->shaderStorageImageMultisample = (uint)local_3e;
  local_3f = dest->shaderStorageImageReadWithoutFormat != 0 ||
             src.shaderStorageImageReadWithoutFormat != 0;
  dest->shaderStorageImageReadWithoutFormat = (uint)local_3f;
  local_40 = dest->shaderStorageImageWriteWithoutFormat != 0 ||
             src.shaderStorageImageWriteWithoutFormat != 0;
  dest->shaderStorageImageWriteWithoutFormat = (uint)local_40;
  local_41 = dest->shaderUniformBufferArrayDynamicIndexing != 0 ||
             src.shaderUniformBufferArrayDynamicIndexing != 0;
  dest->shaderUniformBufferArrayDynamicIndexing = (uint)local_41;
  local_42 = dest->shaderSampledImageArrayDynamicIndexing != 0 ||
             src.shaderSampledImageArrayDynamicIndexing != 0;
  dest->shaderSampledImageArrayDynamicIndexing = (uint)local_42;
  local_43 = dest->shaderStorageBufferArrayDynamicIndexing != 0 ||
             src.shaderStorageBufferArrayDynamicIndexing != 0;
  dest->shaderStorageBufferArrayDynamicIndexing = (uint)local_43;
  local_44 = dest->shaderStorageImageArrayDynamicIndexing != 0 ||
             src.shaderStorageImageArrayDynamicIndexing != 0;
  dest->shaderStorageImageArrayDynamicIndexing = (uint)local_44;
  local_45 = dest->shaderClipDistance != 0 || src.shaderClipDistance != 0;
  dest->shaderClipDistance = (uint)local_45;
  local_46 = dest->shaderCullDistance != 0 || src.shaderCullDistance != 0;
  dest->shaderCullDistance = (uint)local_46;
  local_47 = dest->shaderFloat64 != 0 || src.shaderFloat64 != 0;
  dest->shaderFloat64 = (uint)local_47;
  local_48 = dest->shaderInt64 != 0 || src.shaderInt64 != 0;
  dest->shaderInt64 = (uint)local_48;
  local_49 = dest->shaderInt16 != 0 || src.shaderInt16 != 0;
  dest->shaderInt16 = (uint)local_49;
  local_4a = dest->shaderResourceResidency != 0 || src.shaderResourceResidency != 0;
  dest->shaderResourceResidency = (uint)local_4a;
  local_4b = dest->shaderResourceMinLod != 0 || src.shaderResourceMinLod != 0;
  dest->shaderResourceMinLod = (uint)local_4b;
  local_4c = dest->sparseBinding != 0 || src.sparseBinding != 0;
  dest->sparseBinding = (uint)local_4c;
  local_4d = dest->sparseResidencyBuffer != 0 || src.sparseResidencyBuffer != 0;
  dest->sparseResidencyBuffer = (uint)local_4d;
  local_4e = dest->sparseResidencyImage2D != 0 || src.sparseResidencyImage2D != 0;
  dest->sparseResidencyImage2D = (uint)local_4e;
  local_4f = dest->sparseResidencyImage3D != 0 || src.sparseResidencyImage3D != 0;
  dest->sparseResidencyImage3D = (uint)local_4f;
  local_50 = dest->sparseResidency2Samples != 0 || src.sparseResidency2Samples != 0;
  dest->sparseResidency2Samples = (uint)local_50;
  local_51 = dest->sparseResidency4Samples != 0 || src.sparseResidency4Samples != 0;
  dest->sparseResidency4Samples = (uint)local_51;
  local_52 = dest->sparseResidency8Samples != 0 || src.sparseResidency8Samples != 0;
  dest->sparseResidency8Samples = (uint)local_52;
  local_53 = dest->sparseResidency16Samples != 0 || src.sparseResidency16Samples != 0;
  dest->sparseResidency16Samples = (uint)local_53;
  local_54 = dest->sparseResidencyAliased != 0 || src.sparseResidencyAliased != 0;
  dest->sparseResidencyAliased = (uint)local_54;
  local_55 = dest->variableMultisampleRate != 0 || src.variableMultisampleRate != 0;
  dest->variableMultisampleRate = (uint)local_55;
  local_56 = dest->inheritedQueries != 0 || src.inheritedQueries != 0;
  dest->inheritedQueries = (uint)local_56;
  return;
}

Assistant:

void combine_features(VkPhysicalDeviceFeatures& dest, VkPhysicalDeviceFeatures src){
    dest.robustBufferAccess = dest.robustBufferAccess || src.robustBufferAccess;
	dest.fullDrawIndexUint32 = dest.fullDrawIndexUint32 || src.fullDrawIndexUint32;
	dest.imageCubeArray = dest.imageCubeArray || src.imageCubeArray;
	dest.independentBlend = dest.independentBlend || src.independentBlend;
	dest.geometryShader = dest.geometryShader || src.geometryShader;
	dest.tessellationShader = dest.tessellationShader || src.tessellationShader;
	dest.sampleRateShading = dest.sampleRateShading || src.sampleRateShading;
	dest.dualSrcBlend = dest.dualSrcBlend || src.dualSrcBlend;
	dest.logicOp = dest.logicOp || src.logicOp;
	dest.multiDrawIndirect = dest.multiDrawIndirect || src.multiDrawIndirect;
	dest.drawIndirectFirstInstance = dest.drawIndirectFirstInstance || src.drawIndirectFirstInstance;
	dest.depthClamp = dest.depthClamp || src.depthClamp;
	dest.depthBiasClamp = dest.depthBiasClamp || src.depthBiasClamp;
	dest.fillModeNonSolid = dest.fillModeNonSolid || src.fillModeNonSolid;
	dest.depthBounds = dest.depthBounds || src.depthBounds;
	dest.wideLines = dest.wideLines || src.wideLines;
	dest.largePoints = dest.largePoints || src.largePoints;
	dest.alphaToOne = dest.alphaToOne || src.alphaToOne;
	dest.multiViewport = dest.multiViewport || src.multiViewport;
	dest.samplerAnisotropy = dest.samplerAnisotropy || src.samplerAnisotropy;
	dest.textureCompressionETC2 = dest.textureCompressionETC2 || src.textureCompressionETC2;
	dest.textureCompressionASTC_LDR = dest.textureCompressionASTC_LDR || src.textureCompressionASTC_LDR;
	dest.textureCompressionBC = dest.textureCompressionBC || src.textureCompressionBC;
	dest.occlusionQueryPrecise = dest.occlusionQueryPrecise || src.occlusionQueryPrecise;
	dest.pipelineStatisticsQuery = dest.pipelineStatisticsQuery || src.pipelineStatisticsQuery;
	dest.vertexPipelineStoresAndAtomics = dest.vertexPipelineStoresAndAtomics || src.vertexPipelineStoresAndAtomics;
	dest.fragmentStoresAndAtomics = dest.fragmentStoresAndAtomics || src.fragmentStoresAndAtomics;
	dest.shaderTessellationAndGeometryPointSize = dest.shaderTessellationAndGeometryPointSize || src.shaderTessellationAndGeometryPointSize;
	dest.shaderImageGatherExtended = dest.shaderImageGatherExtended || src.shaderImageGatherExtended;
	dest.shaderStorageImageExtendedFormats = dest.shaderStorageImageExtendedFormats || src.shaderStorageImageExtendedFormats;
	dest.shaderStorageImageMultisample = dest.shaderStorageImageMultisample || src.shaderStorageImageMultisample;
	dest.shaderStorageImageReadWithoutFormat = dest.shaderStorageImageReadWithoutFormat || src.shaderStorageImageReadWithoutFormat;
	dest.shaderStorageImageWriteWithoutFormat = dest.shaderStorageImageWriteWithoutFormat || src.shaderStorageImageWriteWithoutFormat;
	dest.shaderUniformBufferArrayDynamicIndexing = dest.shaderUniformBufferArrayDynamicIndexing || src.shaderUniformBufferArrayDynamicIndexing;
	dest.shaderSampledImageArrayDynamicIndexing = dest.shaderSampledImageArrayDynamicIndexing || src.shaderSampledImageArrayDynamicIndexing;
	dest.shaderStorageBufferArrayDynamicIndexing = dest.shaderStorageBufferArrayDynamicIndexing || src.shaderStorageBufferArrayDynamicIndexing;
	dest.shaderStorageImageArrayDynamicIndexing = dest.shaderStorageImageArrayDynamicIndexing || src.shaderStorageImageArrayDynamicIndexing;
	dest.shaderClipDistance = dest.shaderClipDistance || src.shaderClipDistance;
	dest.shaderCullDistance = dest.shaderCullDistance || src.shaderCullDistance;
	dest.shaderFloat64 = dest.shaderFloat64 || src.shaderFloat64;
	dest.shaderInt64 = dest.shaderInt64 || src.shaderInt64;
	dest.shaderInt16 = dest.shaderInt16 || src.shaderInt16;
	dest.shaderResourceResidency = dest.shaderResourceResidency || src.shaderResourceResidency;
	dest.shaderResourceMinLod = dest.shaderResourceMinLod || src.shaderResourceMinLod;
	dest.sparseBinding = dest.sparseBinding || src.sparseBinding;
	dest.sparseResidencyBuffer = dest.sparseResidencyBuffer || src.sparseResidencyBuffer;
	dest.sparseResidencyImage2D = dest.sparseResidencyImage2D || src.sparseResidencyImage2D;
	dest.sparseResidencyImage3D = dest.sparseResidencyImage3D || src.sparseResidencyImage3D;
	dest.sparseResidency2Samples = dest.sparseResidency2Samples || src.sparseResidency2Samples;
	dest.sparseResidency4Samples = dest.sparseResidency4Samples || src.sparseResidency4Samples;
	dest.sparseResidency8Samples = dest.sparseResidency8Samples || src.sparseResidency8Samples;
	dest.sparseResidency16Samples = dest.sparseResidency16Samples || src.sparseResidency16Samples;
	dest.sparseResidencyAliased = dest.sparseResidencyAliased || src.sparseResidencyAliased;
	dest.variableMultisampleRate = dest.variableMultisampleRate || src.variableMultisampleRate;
	dest.inheritedQueries = dest.inheritedQueries || src.inheritedQueries;
}